

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O1

void do_cmd_sell(command *cmd)

{
  byte *pbVar1;
  uint32_t *puVar2;
  loc grid;
  player_upkeep *ppVar3;
  player *ppVar4;
  _Bool _Var5;
  char cVar6;
  wchar_t wVar7;
  wchar_t guess;
  wchar_t value;
  store_conflict *store;
  object *poVar8;
  char *fmt;
  _Bool none_left;
  object *obj;
  wchar_t amt;
  object *sold_item;
  char o_name [120];
  object dummy_item;
  _Bool local_201;
  object *local_200;
  wchar_t local_1f4;
  object *local_1f0;
  char local_1e8 [128];
  object local_168;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  store = store_at((chunk *)cave,grid);
  local_201 = false;
  wVar7 = cmd_get_arg_item((command_conflict *)cmd,"item",&local_200);
  if (wVar7 != L'\0') {
    return;
  }
  wVar7 = cmd_get_quantity((command_conflict *)cmd,"quantity",&local_1f4,(uint)local_200->number);
  if (wVar7 == L'\0') {
    _Var5 = object_is_equipped(player->body,local_200);
    if ((!_Var5) || (_Var5 = obj_can_takeoff(local_200), _Var5)) {
      if (store == (store_conflict *)0x0) {
        fmt = "You cannot sell items when not in a store.";
      }
      else {
        _Var5 = store_will_buy(store,local_200);
        if (_Var5) {
          object_copy_amt(&local_168,local_200,local_1f4);
          _Var5 = store_check_num(store,&local_168);
          if (_Var5) {
            cVar6 = gear_to_label(player,local_200);
            wVar7 = price_item(store,&local_168,true,local_1f4);
            ppVar4 = player;
            player->au = player->au + wVar7;
            if (local_200->artifact != (artifact *)0x0) {
              history_find_artifact(ppVar4,local_200->artifact);
            }
            ppVar3 = player->upkeep;
            ppVar3->update = ppVar3->update | 0x200;
            *(byte *)&ppVar3->notice = (byte)ppVar3->notice | 1;
            pbVar1 = (byte *)((long)&ppVar3->redraw + 2);
            *pbVar1 = *pbVar1 | 6;
            guess = object_value(&local_168,local_1f4);
            object_wipe(&local_168);
            object_flavor_aware(player,local_200);
            local_200->known->effect = local_200->effect;
            while (_Var5 = object_fully_known(local_200), !_Var5) {
              object_learn_unknown_rune(player,local_200);
              player_know_object(player,local_200);
            }
            local_1f0 = gear_object_for_use(player,local_200,local_1f4,false,&local_201);
            value = object_value_real(local_1f0,local_1f4);
            object_desc(local_1e8,0x78,local_1f0,0x43,player);
            if ((player->opts).opt[0x26] == true) {
              msg("You had %s (%c).",local_1e8,(ulong)(uint)(int)cVar6);
            }
            else {
              msg("You sold %s (%c) for %d gold.",local_1e8,(ulong)(uint)(int)cVar6,
                  (ulong)(uint)wVar7);
              purchase_analyze(wVar7,value,guess);
            }
            if (local_201 == false) {
              apply_autoinscription(player,local_200);
            }
            ppVar4 = player;
            puVar2 = &player->upkeep->notice;
            *puVar2 = *puVar2 | 2;
            notice_stuff(ppVar4);
            handle_stuff(player);
            poVar8 = store_carry(store,local_1f0);
            if (poVar8 == (object *)0x0) {
              if (local_1f0->artifact != (artifact *)0x0) {
                history_lose_artifact(player,local_1f0->artifact);
              }
              if (local_1f0->known != (object *)0x0) {
                object_delete((chunk *)0x0,(chunk *)0x0,&local_1f0->known);
                local_1f0->known = (object *)0x0;
              }
              object_delete((chunk *)0x0,(chunk *)0x0,&local_1f0);
            }
            event_signal(EVENT_STORECHANGED);
            event_signal(EVENT_INVENTORY);
            event_signal(EVENT_EQUIPMENT);
            return;
          }
          object_wipe(&local_168);
          fmt = "I have not the room in my store to keep it.";
        }
        else {
          fmt = "I do not wish to purchase this item.";
        }
      }
    }
    else {
      fmt = "Hmmm, it seems to be stuck.";
    }
    msg(fmt);
    return;
  }
  return;
}

Assistant:

void do_cmd_sell(struct command *cmd)
{
	int amt;
	struct object dummy_item;
	struct store *store = store_at(cave, player->grid);
	int price, dummy, value;
	char o_name[120];
	char label;

	struct object *obj, *sold_item;
	bool none_left = false;

	/* Get arguments */
	/* XXX-AS fill this out, split into cmd-store.c */
	if (cmd_get_arg_item(cmd, "item", &obj) != CMD_OK)
		return;

	if (cmd_get_quantity(cmd, "quantity", &amt, obj->number) != CMD_OK)
		return;

	/* Cannot remove stickied objects */
	if (object_is_equipped(player->body, obj) && !obj_can_takeoff(obj)) {
		msg("Hmmm, it seems to be stuck.");
		return;
	}

	/* Check we are somewhere we can sell the items. */
	if (!store) {
		msg("You cannot sell items when not in a store.");
		return;
	}

	/* Check the store wants the items being sold */
	if (!store_will_buy(store, obj)) {
		msg("I do not wish to purchase this item.");
		return;
	}

	/* Get a copy of the object representing the number being sold */
	object_copy_amt(&dummy_item, obj, amt);

	/* Check if the store has space for the items */
	if (!store_check_num(store, &dummy_item)) {
		object_wipe(&dummy_item);
		msg("I have not the room in my store to keep it.");
		return;
	}

	/* Get the label */
	label = gear_to_label(player, obj);

	price = price_item(store, &dummy_item, true, amt);

	/* Get some money */
	player->au += price;

	/* Update the auto-history if selling an artifact that was previously
	 * un-IDed. (Ouch!) */
	if (obj->artifact)
		history_find_artifact(player, obj->artifact);

	/* Update the gear */
	player->upkeep->update |= (PU_INVEN);

	/* Combine the pack (later) */
	player->upkeep->notice |= (PN_COMBINE);

	/* Redraw stuff */
	player->upkeep->redraw |= (PR_INVEN | PR_EQUIP);

	/* Get the "apparent" value */
	dummy = object_value(&dummy_item, amt);
	/*
	 * Do not need the dummy any more so release the memory allocated
	 * within it.
	 */
	object_wipe(&dummy_item);

	/* Know flavor of consumables */
	object_flavor_aware(player, obj);
	obj->known->effect = obj->effect;
	while (!object_fully_known(obj)) {
		object_learn_unknown_rune(player, obj);
		player_know_object(player, obj);
	}

	/* Take a proper copy of the now known-about object. */
	sold_item = gear_object_for_use(player, obj, amt, false, &none_left);

	/* Get the "actual" value */
	value = object_value_real(sold_item, amt);

	/* Get the description all over again */
	object_desc(o_name, sizeof(o_name), sold_item,
		ODESC_PREFIX | ODESC_FULL, player);

	/* Describe the result (in message buffer) */
	if (OPT(player, birth_no_selling)) {
		msg("You had %s (%c).", o_name, label);
	} else {
		msg("You sold %s (%c) for %d gold.", o_name, label, price);

		/* Analyze the prices (and comment verbally) */
		purchase_analyze(price, value, dummy);
	}

	/* Autoinscribe if we still have any */
	if (!none_left)
		apply_autoinscription(player, obj);

	/* Set ignore flag */
	player->upkeep->notice |= PN_IGNORE;

	/* Notice if pack items need to be combined or reordered */
	notice_stuff(player);

	/* Handle stuff */
	handle_stuff(player);

	/* The store gets that (known) object */
	if (!store_carry(store, sold_item)) {
		/* The store rejected it; delete. */
		if (sold_item->artifact) {
			history_lose_artifact(player, sold_item->artifact);
		}
		if (sold_item->known) {
			object_delete(NULL, NULL, &sold_item->known);
			sold_item->known = NULL;
		}
		object_delete(NULL, NULL, &sold_item);
	}

	event_signal(EVENT_STORECHANGED);
	event_signal(EVENT_INVENTORY);
	event_signal(EVENT_EQUIPMENT);
}